

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O2

Clause * __thiscall EditDistance::getNaiveExplanation(EditDistance *this)

{
  long *plVar1;
  Clause *this_00;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Lit *pLVar5;
  long lVar6;
  long lVar7;
  Clause *c;
  Clause *local_38;
  
  iVar2 = this->seqSize;
  local_38 = (Clause *)malloc((long)iVar2 * 8 + 0xc);
  *(uint *)local_38 = (iVar2 * 2 + 1) * 0x100 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  this_00 = local_38;
  lVar6 = 0;
  lVar7 = 0;
  while( true ) {
    iVar2 = this->seqSize;
    uVar4 = (ulong)iVar2;
    if ((long)uVar4 <= lVar7) break;
    plVar1 = *(long **)((long)&this->seq1->var + lVar6);
    iVar2 = (**(code **)(*plVar1 + 0x68))(plVar1,(long)*(int *)((long)plVar1 + 0xc),0);
    lVar7 = lVar7 + 1;
    pLVar5 = Clause::operator[](this_00,(int)lVar7);
    pLVar5->x = iVar2;
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
    plVar1 = *(long **)((long)&this->seq2->var + lVar6);
    iVar3 = (**(code **)(*plVar1 + 0x68))(plVar1,(long)*(int *)((long)plVar1 + 0xc),0);
    pLVar5 = Clause::operator[](this_00,iVar2 + 1 + (int)lVar7);
    pLVar5->x = iVar3;
    uVar4 = (ulong)(uint)this->seqSize;
    lVar6 = lVar6 + 0x10;
  }
  return this_00;
}

Assistant:

Clause* getNaiveExplanation() const {
		// count number of possible values in total

		const int clauseSize = seqSize * 2 + 1;

		Clause* r = Reason_new(clauseSize);

		int offset = 1;

		// insert all clauses for each variable in sequence 1
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq1[i].getLit(seq1[i].getVal(), LR_NE);
		}
		offset += seqSize;
		// insert all clauses for each variable in sequence 2
		for (int i = 0; i < seqSize; i++) {
			// x != val
			(*r)[offset + i] = seq2[i].getLit(seq2[i].getVal(), LR_NE);
		}

		return r;
	}